

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::ShowColormapSelector(char *label)

{
  bool bVar1;
  char *pcVar2;
  ImVec2 local_30;
  char *local_28;
  char *name;
  int i;
  bool set;
  ImPlotContext *gp;
  char *label_local;
  
  _i = GImPlot;
  name._7_1_ = 0;
  gp = (ImPlotContext *)label;
  pcVar2 = ImPlotColormapData::GetName(&GImPlot->ColormapData,(GImPlot->Style).Colormap);
  bVar1 = ImGui::BeginCombo(label,pcVar2,0);
  if (bVar1) {
    for (name._0_4_ = 0; (int)name < (_i->ColormapData).Count; name._0_4_ = (int)name + 1) {
      pcVar2 = ImPlotColormapData::GetName(&_i->ColormapData,(int)name);
      bVar1 = (_i->Style).Colormap == (int)name;
      local_28 = pcVar2;
      ImVec2::ImVec2(&local_30,0.0,0.0);
      bVar1 = ImGui::Selectable(pcVar2,bVar1,0,&local_30);
      if (bVar1) {
        (_i->Style).Colormap = (int)name;
        BustItemCache();
        name._7_1_ = 1;
      }
    }
    ImGui::EndCombo();
  }
  return (bool)(name._7_1_ & 1);
}

Assistant:

bool ShowColormapSelector(const char* label) {
    ImPlotContext& gp = *GImPlot;
    bool set = false;
    if (ImGui::BeginCombo(label, gp.ColormapData.GetName(gp.Style.Colormap))) {
        for (int i = 0; i < gp.ColormapData.Count; ++i) {
            const char* name = gp.ColormapData.GetName(i);
            if (ImGui::Selectable(name, gp.Style.Colormap == i)) {
                gp.Style.Colormap = i;
                ImPlot::BustItemCache();
                set = true;
            }
        }
        ImGui::EndCombo();
    }
    return set;
}